

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O0

QColor __thiscall QFusionStylePrivate::highlightedOutline(QFusionStylePrivate *this,QPalette *pal)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  QColor QVar3;
  undefined1 auVar4 [16];
  QColor highlightedOutline;
  QPalette *in_stack_ffffffffffffff90;
  QFusionStylePrivate *in_stack_ffffffffffffff98;
  undefined6 local_28;
  undefined2 local_22;
  undefined6 uStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QVar3 = highlight(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uStack_20 = QVar3.ct._4_6_;
  local_28 = QVar3._0_6_;
  local_22 = QVar3.ct._2_2_;
  auVar4 = QColor::darker((int)&local_28);
  local_18 = auVar4._0_8_;
  puStack_10._0_6_ = auVar4._8_6_;
  iVar1 = QColor::value();
  if (0xa0 < iVar1) {
    iVar1 = QColor::hue();
    iVar2 = QColor::saturation();
    QColor::setHsl((int)&local_18,iVar1,iVar2,0xa0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar3._8_8_ = puStack_10;
    QVar3._0_8_ = local_18;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QColor highlightedOutline(const QPalette &pal) const {
        QColor highlightedOutline = highlight(pal).darker(125);
        if (highlightedOutline.value() > 160)
            highlightedOutline.setHsl(highlightedOutline.hue(), highlightedOutline.saturation(), 160);
        return highlightedOutline;
    }